

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscOutboundPacketStream.cpp
# Opt level: O2

OutboundPacketStream * __thiscall
osc::OutboundPacketStream::operator<<(OutboundPacketStream *this,char rhs)

{
  char *pcVar1;
  char cVar2;
  
  CheckForAvailableArgumentSpace(this,4);
  pcVar1 = this->typeTagsCurrent_;
  this->typeTagsCurrent_ = pcVar1 + -1;
  pcVar1[-1] = 'c';
  pcVar1 = this->argumentCurrent_;
  pcVar1[3] = rhs;
  cVar2 = rhs >> 7;
  pcVar1[2] = cVar2;
  pcVar1[1] = cVar2;
  *pcVar1 = cVar2;
  this->argumentCurrent_ = this->argumentCurrent_ + 4;
  return this;
}

Assistant:

OutboundPacketStream& OutboundPacketStream::operator<<( char rhs )
{
    CheckForAvailableArgumentSpace(4);

    *(--typeTagsCurrent_) = CHAR_TYPE_TAG;
    FromInt32( argumentCurrent_, rhs );
    argumentCurrent_ += 4;

    return *this;
}